

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::DumpStatementMaps(FunctionBody *this)

{
  StatementMap *pSVar1;
  int iVar2;
  StatementMapList *this_00;
  WriteBarrierPtr *this_01;
  StatementMap **ppSVar3;
  StatementMap *map;
  int i;
  int count;
  StatementMapList *pStatementMaps;
  FunctionBody *this_local;
  
  this_00 = GetStatementMaps(this);
  if (this_00 != (StatementMapList *)0x0) {
    Output::Print(L"Statement Map:\nstatementId, SourceSpan, ByteCodeSpan\n");
    iVar2 = JsUtil::
            ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>::Count
                      (&this_00->
                        super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                      );
    for (map._0_4_ = 0; (int)(uint)map < iVar2; map._0_4_ = (uint)map + 1) {
      this_01 = (WriteBarrierPtr *)
                JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,(uint)map);
      ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_StatementMap__(this_01);
      pSVar1 = *ppSVar3;
      Output::Print(L"S%4d, (C%5d, C%5d)  (B%5d, B%5d) Inner=%d\n",(ulong)(uint)map,
                    (ulong)(uint)(pSVar1->sourceSpan).begin,(ulong)(uint)(pSVar1->sourceSpan).end,
                    (ulong)(uint)(pSVar1->byteCodeSpan).begin,
                    (ulong)(uint)(pSVar1->byteCodeSpan).end,(uint)(pSVar1->isSubexpression & 1));
    }
  }
  return;
}

Assistant:

void FunctionBody::DumpStatementMaps()
    {
        // Source Map to ByteCode
        StatementMapList * pStatementMaps = this->GetStatementMaps();
        if (pStatementMaps)
        {
            Output::Print(_u("Statement Map:\nstatementId, SourceSpan, ByteCodeSpan\n"));
            int count = pStatementMaps->Count();
            for(int i = 0; i < count; i++)
            {
                StatementMap* map = pStatementMaps->Item(i);

                Output::Print(_u("S%4d, (C%5d, C%5d)  (B%5d, B%5d) Inner=%d\n"), i,
                                                      map->sourceSpan.begin,
                                                      map->sourceSpan.end,
                                                      map->byteCodeSpan.begin,
                                                      map->byteCodeSpan.end,
                                                      map->isSubexpression);
            }
        }
    }